

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O1

ImVector_ImDrawIdx * ImVector_ImDrawIdx_ImVector_ImDrawIdxVector(ImVector_ImDrawIdx *src)

{
  int iVar1;
  ImVector_ImDrawIdx *pIVar2;
  unsigned_short *__dest;
  int iVar3;
  
  pIVar2 = (ImVector_ImDrawIdx *)ImGui::MemAlloc(0x10);
  pIVar2->Size = 0;
  pIVar2->Capacity = 0;
  pIVar2->Data = (unsigned_short *)0x0;
  iVar1 = src->Size;
  if (0 < (long)iVar1) {
    iVar3 = 8;
    if (8 < iVar1) {
      iVar3 = iVar1;
    }
    __dest = (unsigned_short *)ImGui::MemAlloc((ulong)(uint)(iVar3 * 2));
    if (pIVar2->Data != (unsigned_short *)0x0) {
      memcpy(__dest,pIVar2->Data,(long)pIVar2->Size * 2);
      ImGui::MemFree(pIVar2->Data);
    }
    pIVar2->Data = __dest;
    pIVar2->Capacity = iVar3;
  }
  pIVar2->Size = iVar1;
  memcpy(pIVar2->Data,src->Data,(long)iVar1 * 2);
  return pIVar2;
}

Assistant:

CIMGUI_API ImVector_ImDrawIdx* ImVector_ImDrawIdx_ImVector_ImDrawIdxVector(const ImVector_ImDrawIdx src)
{
    return IM_NEW(ImVector_ImDrawIdx)(src);
}